

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolBuilders.cpp
# Opt level: O0

FormalArgumentSymbol * __thiscall
slang::ast::MethodBuilder::copyArg(MethodBuilder *this,FormalArgumentSymbol *fromArg)

{
  DeclaredType *this_00;
  ExpressionSyntax *syntax;
  SourceLocation loc;
  ExpressionSyntax *expr;
  DeclaredType *local_38;
  DeclaredType *fromDT;
  DeclaredType *local_28;
  DeclaredType *argDT;
  FormalArgumentSymbol *arg;
  FormalArgumentSymbol *fromArg_local;
  MethodBuilder *this_local;
  
  arg = fromArg;
  fromArg_local = (FormalArgumentSymbol *)this;
  argDT = (DeclaredType *)
          BumpAllocator::
          emplace<slang::ast::FormalArgumentSymbol,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::ArgumentDirection_const&,slang::ast::VariableLifetime_const&>
                    (&this->compilation->super_BumpAllocator,
                     &(fromArg->super_VariableSymbol).super_ValueSymbol.super_Symbol.name,
                     &(fromArg->super_VariableSymbol).super_ValueSymbol.super_Symbol.location,
                     &fromArg->direction,&(fromArg->super_VariableSymbol).lifetime);
  (((FormalArgumentSymbol *)argDT)->super_VariableSymbol).flags.m_bits =
       (arg->super_VariableSymbol).flags.m_bits;
  Scope::addMember(&this->symbol->super_Scope,(Symbol *)argDT);
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::push_back
            (&(this->args).super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
             (FormalArgumentSymbol **)&argDT);
  fromDT = (DeclaredType *)ValueSymbol::getDeclaredType((ValueSymbol *)argDT);
  local_28 = not_null<slang::ast::DeclaredType_*>::operator*
                       ((not_null<slang::ast::DeclaredType_*> *)&fromDT);
  expr = (ExpressionSyntax *)ValueSymbol::getDeclaredType((ValueSymbol *)arg);
  local_38 = not_null<const_slang::ast::DeclaredType_*>::operator*
                       ((not_null<const_slang::ast::DeclaredType_*> *)&expr);
  DeclaredType::setLink(local_28,local_38);
  syntax = DeclaredType::getInitializerSyntax(local_38);
  this_00 = local_28;
  if (syntax != (ExpressionSyntax *)0x0) {
    loc = DeclaredType::getInitializerLocation(local_38);
    DeclaredType::setInitializerSyntax(this_00,syntax,loc);
  }
  return (FormalArgumentSymbol *)argDT;
}

Assistant:

FormalArgumentSymbol& MethodBuilder::copyArg(const FormalArgumentSymbol& fromArg) {
    auto arg = compilation.emplace<FormalArgumentSymbol>(fromArg.name, fromArg.location,
                                                         fromArg.direction, fromArg.lifetime);
    arg->flags = fromArg.flags;
    symbol.addMember(*arg);
    args.push_back(arg);

    auto& argDT = *arg->getDeclaredType();
    auto& fromDT = *fromArg.getDeclaredType();
    argDT.setLink(fromDT);

    if (auto expr = fromDT.getInitializerSyntax())
        argDT.setInitializerSyntax(*expr, fromDT.getInitializerLocation());

    return *arg;
}